

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LabText.h
# Opt level: O3

char * tsGetString(char *pCurr,char *pEnd,bool recognizeEscapes,char **resultStringBegin,
                  uint32_t *stringLength)

{
  uint32_t uVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (pCurr < pEnd) {
    do {
      if (*pCurr == '\\' && recognizeEscapes) {
        pCurr = pCurr + 1;
      }
      else if (*pCurr == '\"') break;
      pCurr = pCurr + 1;
    } while (pCurr < pEnd);
  }
  if (pEnd <= pCurr) {
    *stringLength = 0;
    return pCurr;
  }
  pcVar2 = pCurr + 1;
  *resultStringBegin = pcVar2;
  for (pcVar3 = pcVar2; pcVar3 < pEnd; pcVar3 = pcVar3 + 1) {
    if (*pcVar3 == '\\' && recognizeEscapes) {
      pcVar3 = pcVar3 + 1;
    }
    else if (*pcVar3 == '\"') break;
  }
  uVar1 = 0;
  if (pcVar3 <= pEnd) {
    uVar1 = (int)pcVar3 - (int)pcVar2;
  }
  *stringLength = uVar1;
  return pcVar3 + 1;
}

Assistant:

char const* tsGetString(
    char const* pCurr, char const* pEnd,
    bool recognizeEscapes,
    char const** resultStringBegin, uint32_t* stringLength)
{
    Assert(pCurr && pEnd && pEnd >= pCurr);

    pCurr = tsScanForQuote(pCurr, pEnd, '\"', recognizeEscapes);

    if (pCurr < pEnd)
    {
        ++pCurr;    // skip past quote
        *resultStringBegin = pCurr;

        pCurr = tsScanForQuote(pCurr, pEnd, '\"', recognizeEscapes);

        if (pCurr <= pEnd)
            *stringLength = (uint32_t)(pCurr - *resultStringBegin);
        else
            *stringLength = 0;

        ++pCurr;    // point past closing quote
    }
    else
        *stringLength = 0;

    return pCurr;
}